

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O1

int __thiscall ModelWriter::shape_inference(ModelWriter *this)

{
  Option *pOVar1;
  undefined8 *puVar2;
  int iVar3;
  Layer *pLVar4;
  pointer pBVar5;
  int *piVar6;
  Allocator *pAVar7;
  pointer pMVar8;
  void *pvVar9;
  long *plVar10;
  undefined8 uVar11;
  int iVar12;
  pointer piVar13;
  bool bVar14;
  int iVar15;
  long lVar16;
  Mat *pMVar17;
  ModelWriter *pMVar18;
  char cVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  Extractor ex;
  Mat local_c8;
  ModelWriter *local_78;
  long local_70;
  long local_68;
  pointer local_60;
  pointer local_58;
  Extractor local_50;
  pointer local_40;
  pointer local_38;
  
  if (this->has_custom_layer == true) {
    shape_inference();
LAB_0015cc29:
    iVar12 = -1;
  }
  else {
    local_58 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    local_60 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    local_70 = (long)local_60 - (long)local_58 >> 3;
    local_40 = (this->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
               super__Vector_impl_data._M_start;
    local_38 = (this->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    if (local_60 != local_58) {
      pOVar1 = &(this->super_Net).opt;
      lVar16 = local_70 + (ulong)(local_70 == 0);
      lVar21 = 0;
      do {
        pLVar4 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar21];
        (*pLVar4->_vptr_Layer[5])(pLVar4,pOVar1);
        iVar12 = (*pLVar4->_vptr_Layer[4])(pLVar4,pOVar1);
        if (iVar12 != 0) {
          shape_inference();
          goto LAB_0015cc29;
        }
        lVar21 = lVar21 + 1;
      } while (lVar16 != lVar21);
    }
    ncnn::Net::create_extractor((Net *)&local_50);
    ncnn::Extractor::set_light_mode(&local_50,true);
    local_78 = this;
    if (local_60 != local_58) {
      lVar16 = local_70 + (ulong)(local_70 == 0);
      lVar21 = 0;
      do {
        pLVar4 = (local_78->layers->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar21];
        iVar12 = std::__cxx11::string::compare((char *)&pLVar4->type);
        iVar15 = 9;
        if ((iVar12 != 0) &&
           (iVar12 = std::__cxx11::string::compare((char *)&pLVar4->type), iVar12 == 0)) {
          iVar12 = *(int *)&pLVar4[1]._vptr_Layer;
          iVar15 = *(int *)((long)&pLVar4[1]._vptr_Layer + 4);
          iVar3._0_1_ = pLVar4[1].support_bf16_storage;
          iVar3._1_1_ = pLVar4[1].support_fp16_storage;
          iVar3._2_1_ = pLVar4[1].support_int8_storage;
          iVar3._3_1_ = pLVar4[1].support_image_storage;
          bVar23 = iVar12 != 0;
          bVar14 = (iVar15 == 0 && iVar3 == 0) && bVar23;
          bVar24 = iVar15 == 0;
          local_68 = CONCAT44(local_68._4_4_,iVar3);
          bVar25 = iVar3 == 0;
          cVar19 = bVar14;
          if (bVar25) {
            cVar19 = '\x02';
          }
          if (bVar24 || !bVar23) {
            cVar19 = bVar14;
          }
          if (!bVar25 && (!bVar24 && bVar23)) {
            cVar19 = '\x03';
          }
          if (cVar19 == '\0') {
            shape_inference((ModelWriter *)pLVar4);
            iVar15 = 1;
          }
          else {
            local_c8.cstep = 0;
            local_c8.data = (void *)0x0;
            local_c8.refcount._0_4_ = 0;
            local_c8.refcount._4_4_ = 0;
            local_c8.elemsize._0_4_ = 0;
            local_c8.elemsize._4_4_ = 0;
            local_c8.elempack = 0;
            local_c8.h = 0;
            local_c8.d = 0;
            local_c8.c = 0;
            local_c8.allocator = (Allocator *)0x0;
            local_c8.dims = 0;
            local_c8.w = 0;
            if (cVar19 == '\x03') {
LAB_0015c4ad:
              ncnn::Mat::create(&local_c8,iVar12,iVar15,(int)local_68,4,(Allocator *)0x0);
            }
            else if (cVar19 == '\x02') {
LAB_0015c491:
              ncnn::Mat::create(&local_c8,iVar12,iVar15,4,(Allocator *)0x0);
              if (!bVar25 && (!bVar24 && bVar23)) goto LAB_0015c4ad;
            }
            else {
              ncnn::Mat::create(&local_c8,iVar12,4,(Allocator *)0x0);
              if (cVar19 == '\x03') goto LAB_0015c4ad;
              if (cVar19 == '\x02') goto LAB_0015c491;
            }
            ncnn::Extractor::input
                      (&local_50,
                       **(int **)&(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl,&local_c8);
            piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (local_c8.allocator == (Allocator *)0x0) {
                  if (local_c8.data != (void *)0x0) {
                    free(local_c8.data);
                  }
                }
                else {
                  (*(local_c8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_c8.cstep = 0;
            local_c8.data = (void *)0x0;
            local_c8.refcount._0_4_ = 0;
            local_c8.refcount._4_4_ = 0;
            local_c8.elemsize._0_4_ = 0;
            local_c8.elemsize._4_4_ = 0;
            local_c8.elempack = 0;
            local_c8.dims = 0;
            local_c8.w = 0;
            local_c8.h = 0;
            local_c8.d = 0;
            local_c8.c = 0;
            iVar15 = 0;
          }
        }
        if ((iVar15 != 9) && (iVar15 != 0)) {
          iVar12 = -1;
          goto LAB_0015c572;
        }
        lVar21 = lVar21 + 1;
      } while (lVar16 != lVar21);
    }
    pMVar18 = local_78;
    if (local_38 != local_40) {
      lVar16 = ((long)local_38 - (long)local_40 >> 4) * 0x6db6db6db6db6db7;
      lVar22 = 0x60;
      lVar21 = 0;
      do {
        pBVar5 = (pMVar18->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        iVar12 = *(int *)((long)pBVar5 + lVar22 + -0x10);
        if (iVar12 != 0) {
          iVar15 = *(int *)((long)pBVar5 + lVar22 + -0xc);
          iVar3 = *(int *)((long)pBVar5 + lVar22 + -8);
          local_c8.cstep = 0;
          local_c8.data = (void *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize._0_4_ = 0;
          local_c8.elemsize._4_4_ = 0;
          local_c8.elempack = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          if (iVar12 == 3) {
            local_c8.cstep = 0;
            local_c8.c = 0;
            local_c8.d = 0;
            local_c8.h = 0;
            local_c8.w = 0;
            local_c8.dims = 0;
            local_c8.allocator = (Allocator *)0x0;
            local_c8.elempack = 0;
            local_c8.elemsize._4_4_ = 0;
            local_c8.elemsize._0_4_ = 0;
            local_c8.refcount._4_4_ = 0;
            local_c8.refcount._0_4_ = 0;
            local_c8.data = (void *)0x0;
            ncnn::Mat::create(&local_c8,iVar15,iVar3,
                              *(int *)((long)&(pBVar5->name)._M_dataplus._M_p + lVar22),4,
                              (Allocator *)0x0);
          }
          else if (iVar12 == 2) {
            local_c8.cstep = 0;
            local_c8.c = 0;
            local_c8.d = 0;
            local_c8.h = 0;
            local_c8.w = 0;
            local_c8.dims = 0;
            local_c8.allocator = (Allocator *)0x0;
            local_c8.elempack = 0;
            local_c8.elemsize._4_4_ = 0;
            local_c8.elemsize._0_4_ = 0;
            local_c8.refcount._4_4_ = 0;
            local_c8.refcount._0_4_ = 0;
            local_c8.data = (void *)0x0;
            ncnn::Mat::create(&local_c8,iVar15,iVar3,4,(Allocator *)0x0);
          }
          else if (iVar12 == 1) {
            ncnn::Mat::create(&local_c8,iVar15,4,(Allocator *)0x0);
          }
          if (0 < local_c8.c * (int)local_c8.cstep) {
            memset(local_c8.data,0,(ulong)(uint)(local_c8.c * (int)local_c8.cstep) << 2);
          }
          ncnn::Extractor::input(&local_50,(int)lVar21,&local_c8);
          pMVar18 = local_78;
          piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_c8.allocator == (Allocator *)0x0) {
                if (local_c8.data != (void *)0x0) {
                  free(local_c8.data);
                }
              }
              else {
                (*(local_c8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_c8.cstep = 0;
          local_c8.data = (void *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize._0_4_ = 0;
          local_c8.elemsize._4_4_ = 0;
          local_c8.elempack = 0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
        }
        lVar21 = lVar21 + 1;
        lVar22 = lVar22 + 0x70;
      } while (lVar16 + (ulong)(lVar16 == 0) != lVar21);
    }
    fwrite("shape_inference\n",0x10,1,_stderr);
    if (local_60 != local_58) {
      local_68 = local_70 + (ulong)(local_70 == 0);
      lVar16 = 0;
      do {
        pLVar4 = (pMVar18->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[lVar16];
        iVar12 = std::__cxx11::string::compare((char *)&pLVar4->type);
        if ((iVar12 != 0) &&
           (piVar13 = (pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
           (pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish != piVar13)) {
          uVar20 = 0;
          do {
            iVar12 = piVar13[uVar20];
            local_c8.cstep = 0;
            local_c8.data = (void *)0x0;
            local_c8.refcount._0_4_ = 0;
            local_c8.refcount._4_4_ = 0;
            local_c8.elemsize._0_4_ = 0;
            local_c8.elemsize._4_4_ = 0;
            local_c8.elempack = 0;
            local_c8.h = 0;
            local_c8.d = 0;
            local_c8.c = 0;
            local_c8.allocator = (Allocator *)0x0;
            local_c8.dims = 0;
            local_c8.w = 0;
            ncnn::Extractor::extract(&local_50,iVar12,&local_c8,0);
            pBVar5 = (local_78->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            pMVar17 = &pBVar5[iVar12].shape;
            if (pMVar17 != &local_c8) {
              piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + 1;
                UNLOCK();
              }
              piVar6 = pBVar5[iVar12].shape.refcount;
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  pAVar7 = pBVar5[iVar12].shape.allocator;
                  if (pAVar7 == (Allocator *)0x0) {
                    if (pMVar17->data != (void *)0x0) {
                      free(pMVar17->data);
                    }
                  }
                  else {
                    (*pAVar7->_vptr_Allocator[3])();
                  }
                }
              }
              pBVar5[iVar12].shape.cstep = 0;
              pMVar17->data = (void *)0x0;
              pBVar5[iVar12].shape.refcount = (int *)0x0;
              *(undefined8 *)((long)&pBVar5[iVar12].shape.refcount + 4) = 0;
              *(undefined8 *)((long)&pBVar5[iVar12].shape.elemsize + 4) = 0;
              pBVar5[iVar12].shape.dims = 0;
              pBVar5[iVar12].shape.w = 0;
              pBVar5[iVar12].shape.h = 0;
              pBVar5[iVar12].shape.d = 0;
              pBVar5[iVar12].shape.c = 0;
              pMVar17->data = local_c8.data;
              pBVar5[iVar12].shape.refcount =
                   (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
              pBVar5[iVar12].shape.elemsize =
                   CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
              pBVar5[iVar12].shape.elempack = local_c8.elempack;
              pBVar5[iVar12].shape.allocator = local_c8.allocator;
              pBVar5[iVar12].shape.dims = local_c8.dims;
              pBVar5[iVar12].shape.w = local_c8.w;
              pBVar5[iVar12].shape.h = local_c8.h;
              pBVar5[iVar12].shape.d = local_c8.d;
              pBVar5[iVar12].shape.c = local_c8.c;
              pBVar5[iVar12].shape.cstep = local_c8.cstep;
            }
            pMVar18 = local_78;
            piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (local_c8.allocator == (Allocator *)0x0) {
                  if (local_c8.data != (void *)0x0) {
                    free(local_c8.data);
                  }
                }
                else {
                  (*(local_c8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_c8.cstep = 0;
            local_c8.data = (void *)0x0;
            local_c8.refcount._0_4_ = 0;
            local_c8.refcount._4_4_ = 0;
            local_c8.elemsize._0_4_ = 0;
            local_c8.elemsize._4_4_ = 0;
            local_c8.elempack = 0;
            local_c8.dims = 0;
            local_c8.w = 0;
            local_c8.h = 0;
            local_c8.d = 0;
            local_c8.c = 0;
            uVar20 = uVar20 + 1;
            piVar13 = (pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          } while (uVar20 < (ulong)((long)(pLVar4->tops).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish - (long)piVar13 >> 2));
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != local_68);
    }
    if (local_60 != local_58) {
      local_70 = local_70 + (ulong)(local_70 == 0);
      lVar16 = 0;
      do {
        pLVar4 = (pMVar18->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[lVar16];
        local_68 = lVar16;
        iVar12 = std::__cxx11::string::compare((char *)&pLVar4->type);
        if (iVar12 != 0) {
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                    (&pLVar4->bottom_shapes,
                     (long)(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     *(long *)&(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data >> 2);
          piVar13 = (pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish != piVar13) {
            lVar16 = 0;
            uVar20 = 0;
            do {
              iVar12 = piVar13[uVar20];
              pBVar5 = (local_78->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pMVar8 = (pLVar4->bottom_shapes).
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar2 = (undefined8 *)((long)&pMVar8->data + lVar16);
              if ((Mat *)puVar2 != &pBVar5[iVar12].shape) {
                piVar6 = pBVar5[iVar12].shape.refcount;
                if (piVar6 != (int *)0x0) {
                  LOCK();
                  *piVar6 = *piVar6 + 1;
                  UNLOCK();
                }
                piVar6 = *(int **)((long)&pMVar8->refcount + lVar16);
                if (piVar6 != (int *)0x0) {
                  LOCK();
                  *piVar6 = *piVar6 + -1;
                  UNLOCK();
                  if (*piVar6 == 0) {
                    pvVar9 = *(void **)((long)&pMVar8->data + lVar16);
                    plVar10 = *(long **)((long)&pMVar8->allocator + lVar16);
                    if (plVar10 == (long *)0x0) {
                      if (pvVar9 != (void *)0x0) {
                        free(pvVar9);
                      }
                    }
                    else {
                      (**(code **)(*plVar10 + 0x18))();
                    }
                  }
                }
                *(undefined8 *)((long)&pMVar8->cstep + lVar16) = 0;
                *(undefined8 *)((long)puVar2 + 0xc) = 0;
                *(undefined8 *)((long)puVar2 + 0x14) = 0;
                *puVar2 = 0;
                puVar2[1] = 0;
                puVar2 = (undefined8 *)((long)&pMVar8->dims + lVar16);
                *puVar2 = 0;
                puVar2[1] = 0;
                *(undefined4 *)((long)&pMVar8->c + lVar16) = 0;
                piVar6 = pBVar5[iVar12].shape.refcount;
                puVar2 = (undefined8 *)((long)&pMVar8->data + lVar16);
                *puVar2 = pBVar5[iVar12].shape.data;
                puVar2[1] = piVar6;
                *(size_t *)((long)&pMVar8->elemsize + lVar16) = pBVar5[iVar12].shape.elemsize;
                *(int *)((long)&pMVar8->elempack + lVar16) = pBVar5[iVar12].shape.elempack;
                *(Allocator **)((long)&pMVar8->allocator + lVar16) = pBVar5[iVar12].shape.allocator;
                uVar11 = *(undefined8 *)&pBVar5[iVar12].shape.h;
                puVar2 = (undefined8 *)((long)&pMVar8->dims + lVar16);
                *puVar2 = *(undefined8 *)&pBVar5[iVar12].shape.dims;
                puVar2[1] = uVar11;
                *(int *)((long)&pMVar8->c + lVar16) = pBVar5[iVar12].shape.c;
                *(size_t *)((long)&pMVar8->cstep + lVar16) = pBVar5[iVar12].shape.cstep;
              }
              uVar20 = uVar20 + 1;
              piVar13 = (pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar16 = lVar16 + 0x48;
            } while (uVar20 < (ulong)((long)(pLVar4->bottoms).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_finish - (long)piVar13 >> 2))
            ;
          }
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                    (&pLVar4->top_shapes,
                     (long)(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     *(long *)&(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data >> 2);
          piVar13 = (pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish != piVar13) {
            lVar16 = 0;
            uVar20 = 0;
            do {
              iVar12 = piVar13[uVar20];
              pBVar5 = (local_78->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pMVar8 = (pLVar4->top_shapes).
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar2 = (undefined8 *)((long)&pMVar8->data + lVar16);
              if ((Mat *)puVar2 != &pBVar5[iVar12].shape) {
                piVar6 = pBVar5[iVar12].shape.refcount;
                if (piVar6 != (int *)0x0) {
                  LOCK();
                  *piVar6 = *piVar6 + 1;
                  UNLOCK();
                }
                piVar6 = *(int **)((long)&pMVar8->refcount + lVar16);
                if (piVar6 != (int *)0x0) {
                  LOCK();
                  *piVar6 = *piVar6 + -1;
                  UNLOCK();
                  if (*piVar6 == 0) {
                    pvVar9 = *(void **)((long)&pMVar8->data + lVar16);
                    plVar10 = *(long **)((long)&pMVar8->allocator + lVar16);
                    if (plVar10 == (long *)0x0) {
                      if (pvVar9 != (void *)0x0) {
                        free(pvVar9);
                      }
                    }
                    else {
                      (**(code **)(*plVar10 + 0x18))();
                    }
                  }
                }
                *(undefined8 *)((long)&pMVar8->cstep + lVar16) = 0;
                *(undefined8 *)((long)puVar2 + 0xc) = 0;
                *(undefined8 *)((long)puVar2 + 0x14) = 0;
                *puVar2 = 0;
                puVar2[1] = 0;
                puVar2 = (undefined8 *)((long)&pMVar8->dims + lVar16);
                *puVar2 = 0;
                puVar2[1] = 0;
                *(undefined4 *)((long)&pMVar8->c + lVar16) = 0;
                piVar6 = pBVar5[iVar12].shape.refcount;
                puVar2 = (undefined8 *)((long)&pMVar8->data + lVar16);
                *puVar2 = pBVar5[iVar12].shape.data;
                puVar2[1] = piVar6;
                *(size_t *)((long)&pMVar8->elemsize + lVar16) = pBVar5[iVar12].shape.elemsize;
                *(int *)((long)&pMVar8->elempack + lVar16) = pBVar5[iVar12].shape.elempack;
                *(Allocator **)((long)&pMVar8->allocator + lVar16) = pBVar5[iVar12].shape.allocator;
                uVar11 = *(undefined8 *)&pBVar5[iVar12].shape.h;
                puVar2 = (undefined8 *)((long)&pMVar8->dims + lVar16);
                *puVar2 = *(undefined8 *)&pBVar5[iVar12].shape.dims;
                puVar2[1] = uVar11;
                *(int *)((long)&pMVar8->c + lVar16) = pBVar5[iVar12].shape.c;
                *(size_t *)((long)&pMVar8->cstep + lVar16) = pBVar5[iVar12].shape.cstep;
              }
              uVar20 = uVar20 + 1;
              piVar13 = (pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar16 = lVar16 + 0x48;
            } while (uVar20 < (ulong)((long)(pLVar4->tops).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_finish - (long)piVar13 >> 2))
            ;
          }
        }
        lVar16 = local_68 + 1;
        pMVar18 = local_78;
      } while (lVar16 != local_70);
    }
    iVar12 = 0;
LAB_0015c572:
    ncnn::Extractor::~Extractor(&local_50);
  }
  return iVar12;
}

Assistant:

int ModelWriter::shape_inference()
{
    if (has_custom_layer)
    {
        fprintf(stderr, "model has custom layer, shape_inference skipped\n");
        return -1;
    }

    const size_t layer_count = layers.size();
    const size_t blob_count = blobs.size();

    // recreate layer pipeline for param and weight changes
    for (size_t i = 0; i < layer_count; i++)
    {
        ncnn::Layer* layer = layers[i];

        layer->destroy_pipeline(opt);

        int cret = layer->create_pipeline(opt);
        if (cret != 0)
        {
            NCNN_LOGE("layer create_pipeline %d %s failed", (int)i, layer->name.c_str());
            return -1;
        }
    }

    ncnn::Extractor ex = create_extractor();
    ex.set_light_mode(true);

    // prepare Input blobs
    for (size_t i = 0; i < layer_count; i++)
    {
        const ncnn::Layer* layer = layers[i];
        if (layer->type == "ncnnfused")
            continue;

        if (layer->type != "Input")
            continue;

        ncnn::Input* input = (ncnn::Input*)layer;

        int w = input->w;
        int h = input->h;
        int c = input->c;

        int dims = 0;
        if (w == 0 && h == 0 && c == 0) dims = 0;
        if (w != 0 && h == 0 && c == 0) dims = 1;
        if (w != 0 && h != 0 && c == 0) dims = 2;
        if (w != 0 && h != 0 && c != 0) dims = 3;

        if (dims == 0)
        {
            fprintf(stderr, "Input layer %s without shape info, shape_inference skipped\n", layer->name.c_str());
            return -1;
        }

        ncnn::Mat m;
        if (dims == 1) m.create(w);
        if (dims == 2) m.create(w, h);
        if (dims == 3) m.create(w, h, c);

        ex.input(layer->tops[0], m);
    }

    // prepare blobs with predefined shape
    for (size_t i = 0; i < blob_count; i++)
    {
        const ncnn::Blob& blob = blobs[i];

        int dims = blob.shape.dims;
        int w = blob.shape.w;
        int h = blob.shape.h;
        int c = blob.shape.c;

        if (dims == 0)
            continue;

        ncnn::Mat m;
        if (dims == 1) m.create(w);
        if (dims == 2) m.create(w, h);
        if (dims == 3) m.create(w, h, c);

        m.fill(0.f);

        ex.input(int(i), m);
    }

    fprintf(stderr, "shape_inference\n");

    // resolve all layer output blob shape
    for (size_t i = 0; i < layer_count; i++)
    {
        const ncnn::Layer* layer = layers[i];
        if (layer->type == "ncnnfused")
            continue;

        for (size_t j = 0; j < layer->tops.size(); j++)
        {
            int top_blob_index = layer->tops[j];

            ncnn::Mat m;
            ex.extract(top_blob_index, m);

            blobs[top_blob_index].shape = m;
        }
    }

    // assign all layer blob shape
    for (size_t i = 0; i < layer_count; i++)
    {
        ncnn::Layer* layer = layers[i];
        if (layer->type == "ncnnfused")
            continue;

        layer->bottom_shapes.resize(layer->bottoms.size());
        for (size_t j = 0; j < layer->bottoms.size(); j++)
        {
            int bottom_blob_index = layer->bottoms[j];

            layer->bottom_shapes[j] = blobs[bottom_blob_index].shape;
        }

        layer->top_shapes.resize(layer->tops.size());
        for (size_t j = 0; j < layer->tops.size(); j++)
        {
            int top_blob_index = layer->tops[j];

            layer->top_shapes[j] = blobs[top_blob_index].shape;

            //             fprintf(stderr, "%d %4d %4d %4d | %2d %s\n", blobs[top_blob_index].shape.dims, blobs[top_blob_index].shape.w, blobs[top_blob_index].shape.h, blobs[top_blob_index].shape.c, top_blob_index, blobs[top_blob_index].name.c_str());
        }
    }

    return 0;
}